

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O2

void __thiscall FunctionAnalyser::visit(FunctionAnalyser *this,FunctionSymbol *symbol)

{
  this->symbolValid_ = true;
  std::__cxx11::list<TypeName,_std::allocator<TypeName>_>::operator=
            (&this->arguments_,&symbol->arguments_);
  (this->returnType_).super__Optional_base<TypeName,_true,_true>._M_payload.
  super__Optional_payload_base<TypeName> =
       (_Optional_payload_base<TypeName>)((ulong)symbol->returnType_ | 0x100000000);
  return;
}

Assistant:

void FunctionAnalyser::visit(FunctionSymbol& symbol)
{
  symbolValid_ = true;
  arguments_ = symbol.getArguments();
  returnType_ = symbol.getReturnType();
}